

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_poison_dust(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *pCVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  CClass *this;
  char *pcVar7;
  long lVar8;
  CHAR_DATA *victim;
  AFFECT_DATA af;
  char buf [4608];
  AFFECT_DATA local_1290;
  char local_1228 [4608];
  
  iVar5 = get_skill(ch,(int)gsn_poison_dust);
  if (iVar5 != 0) {
    sVar1 = ch->level;
    lVar8 = (long)gsn_poison_dust;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar6 = CClass::GetIndex(this);
    if (*(short *)(lVar8 * 0x60 + 0x44e788 + (long)iVar6 * 2) <= sVar1) {
      if (0x13 < ch->mana) {
        iVar6 = number_percent();
        if ((float)iVar5 < (float)iVar6) {
          act("$n hurls some dust into the air but it is blown away.",ch,(void *)0x0,(void *)0x0,0);
          send_to_char("You throw out some dust but it is blown away.\n\r",ch);
          ch->mana = ch->mana + -10;
          WAIT_STATE(ch,0xc);
          check_improve(ch,(int)gsn_poison_dust,false,2);
          return;
        }
        act("$n hurls a handful of dust into the room!",ch,(void *)0x0,(void *)0x0,0);
        send_to_char("You throw a handful of poison dust into the room!\n\r",ch);
        check_improve(ch,(int)gsn_poison_dust,true,2);
        pCVar2 = ch->fighting;
        local_1290.aftype = 1;
        init_affect(&local_1290);
        local_1290.where = 0;
        local_1290.type = gsn_poison;
        local_1290.aftype = 3;
        local_1290.level = ch->level;
        local_1290.duration = local_1290.level / 5;
        local_1290.bitvector[0]._1_1_ = local_1290.bitvector[0]._1_1_ | 0x10;
        local_1290.location = 1;
        local_1290.modifier = -5;
        local_1290.tick_fun = poison_tick;
        ch->mana = ch->mana + -0x14;
        WAIT_STATE(ch,0xc);
        pCVar3 = ch->in_room->people;
        do {
          victim = pCVar3;
          if (victim == (CHAR_DATA *)0x0) {
            return;
          }
          pCVar3 = victim->next_in_room;
          bVar4 = is_safe_new(ch,victim,true);
        } while (((bVar4) || (bVar4 = is_immortal(victim), bVar4)) ||
                (bVar4 = is_same_group(ch,victim), bVar4));
        bVar4 = is_affected_by(victim,0xc);
        if ((!bVar4) && (bVar4 = saves_spell((int)ch->level,victim,8), !bVar4)) {
          act("$n turns green and looks sick.",victim,(void *)0x0,(void *)0x0,0);
          send_to_char("You suddenly feel very sick.\n\r",victim);
          affect_to_char(victim,&local_1290);
        }
        bVar4 = is_npc(victim);
        if (((!bVar4) && (bVar4 = is_npc(ch), !bVar4)) &&
           ((victim->fighting == (CHAR_DATA *)0x0 || (pCVar2 == (CHAR_DATA *)0x0)))) {
          pcVar7 = pers(ch,victim);
          sprintf(local_1228,"Help! %s just threw dust in my eyes!",pcVar7);
          do_myell(victim,local_1228,ch);
        }
        return;
      }
      pcVar7 = "You don\'t have the mana.\n\r";
      goto LAB_00297cf7;
    }
  }
  pcVar7 = "You don\'t know how to make poison dust to throw.\n\r";
LAB_00297cf7:
  send_to_char(pcVar7,ch);
  return;
}

Assistant:

void do_poison_dust(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	AFFECT_DATA af;
	float chance;
	bool fighting = false;
	char buf[MAX_STRING_LENGTH];

	chance = get_skill(ch, gsn_poison_dust);

	if (chance == 0
		|| ch->level < skill_table[gsn_poison_dust].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to make poison dust to throw.\n\r", ch);
		return;
	}

	if (ch->mana < 20)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		act("$n hurls some dust into the air but it is blown away.", ch, 0, 0, TO_ROOM);
		send_to_char("You throw out some dust but it is blown away.\n\r", ch);
		ch->mana -= 10;

		WAIT_STATE(ch, 12);
		check_improve(ch, gsn_poison_dust, false, 2);
		return;
	}

	act("$n hurls a handful of dust into the room!", ch, 0, 0, TO_ROOM);
	send_to_char("You throw a handful of poison dust into the room!\n\r", ch);
	check_improve(ch, gsn_poison_dust, true, 2);

	if (ch->fighting != nullptr)
		fighting = true;

	af.aftype = AFT_SKILL;
	init_affect(&af);

	af.where = TO_AFFECTS;
	af.type = gsn_poison;
	af.aftype = AFT_MALADY;
	af.level = ch->level;
	af.duration = ch->level / 5;

	SET_BIT(af.bitvector, AFF_POISON);

	af.location = APPLY_STR;
	af.modifier = -5;
	af.tick_fun = poison_tick;
	ch->mana -= 20;

	WAIT_STATE(ch, 12);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch) || is_immortal(vch))
			continue;

		if (is_same_group(ch, vch))
			continue;

		if (!is_affected_by(vch, AFF_POISON) && !saves_spell(ch->level, vch, DAM_POISON))
		{
			act("$n turns green and looks sick.", vch, 0, 0, TO_ROOM);
			send_to_char("You suddenly feel very sick.\n\r", vch);
			affect_to_char(vch, &af);
		}

		if (!is_npc(vch) && !is_npc(ch) && (vch->fighting == nullptr || (!fighting)))
		{
			sprintf(buf, "Help! %s just threw dust in my eyes!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}
	return;

		if (vch->fighting == nullptr)
			multi_hit(vch, ch, TYPE_UNDEFINED);
	}
}